

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

bool __thiscall Args::Arg::isMisspelledName(Arg *this,String *name,StringList *possibleNames)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[8])();
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 8) != 0) {
    std::__cxx11::string::string((string *)&local_60,"--",&local_61);
    iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[8])(this);
    std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    bVar1 = details::isMisspelledName(name,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_60,"--",&local_61);
      iVar2 = (*(this->super_ArgIface)._vptr_ArgIface[8])(this);
      std::operator+(&local_40,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_01,iVar2));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)possibleNames,
                 &local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      return true;
    }
  }
  return false;
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const override
	{
		if( !argumentName().empty() )
		{
			if( details::isMisspelledName( name,
				String( SL( "--" ) ) + argumentName() ) )
			{
				possibleNames.push_back( String( SL( "--" ) ) + argumentName() );

				return true;
			}
		}

		return false;
	}